

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

ScriptFunction * __thiscall
Js::JavascriptLibrary::CreateScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  ScriptFunctionType *pSVar7;
  Recycler *pRVar8;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *this_00;
  FunctionWithHomeObj<Js::ScriptFunction> *this_01;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pFVar6 = (proxy->functionInfo).ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x568,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00bea83f;
    *puVar5 = 0;
    pFVar6 = (proxy->functionInfo).ptr;
  }
  if ((pFVar6->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_00bea83f;
    *puVar5 = 0;
    pFVar6 = (proxy->functionInfo).ptr;
  }
  if (((pFVar6->attributes & ClassConstructor) == None) ||
     (pSVar7 = FunctionProxy::GetUndeferredFunctionType(proxy), pSVar7 == (ScriptFunctionType *)0x0)
     ) {
    pSVar7 = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  }
  else {
    pSVar7 = FunctionProxy::GetUndeferredFunctionType(proxy);
  }
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  pRVar8 = this->recycler;
  if ((TVar1 >> 0x17 & 1) == 0) {
    if ((TVar1 >> 0x19 & 1) != 0) {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::ScriptFunction>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_765c5cc;
      data.filename._0_4_ = 0x18ec;
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00bea83f;
        *puVar5 = 0;
      }
      this_01 = (FunctionWithHomeObj<Js::ScriptFunction> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                          (pRVar8,0x50);
      if (this_01 == (FunctionWithHomeObj<Js::ScriptFunction> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00bea83f;
        *puVar5 = 0;
      }
      FunctionWithHomeObj<Js::ScriptFunction>::FunctionWithHomeObj(this_01,proxy,pSVar7);
      return &this_01->super_ScriptFunction;
    }
    local_50 = (undefined1  [8])&ScriptFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_765c5cc;
    data.filename._0_4_ = 0x18f2;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bea83f;
      *puVar5 = 0;
    }
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar8,0x48);
    if (this_00 == (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00bea83f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ScriptFunction::ScriptFunction((ScriptFunction *)this_00,proxy,pSVar7);
  }
  else if ((TVar1 >> 0x19 & 1) == 0) {
    local_50 = (undefined1  [8])&FunctionWithComputedName<Js::ScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_765c5cc;
    data.filename._0_4_ = 0x18f0;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bea83f;
      *puVar5 = 0;
    }
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar8,0x50);
    if (this_00 == (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00bea83f;
      *puVar5 = 0;
    }
    FunctionWithComputedName<Js::ScriptFunction>::FunctionWithComputedName
              ((FunctionWithComputedName<Js::ScriptFunction> *)this_00,proxy,pSVar7);
  }
  else {
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_765c5cc;
    data.filename._0_4_ = 0x18e8;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bea83f;
      *puVar5 = 0;
    }
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar8,0x58);
    if (this_00 == (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00bea83f;
      *puVar5 = 0;
    }
    FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::FunctionWithComputedName
              (this_00,proxy,pSVar7);
  }
  return (ScriptFunction *)this_00;
}

Assistant:

ScriptFunction* JavascriptLibrary::CreateScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType * type = proxy->IsClassConstructor() && proxy->GetUndeferredFunctionType() ? proxy->GetUndeferredFunctionType() : proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<ScriptFunction>>, proxy, type);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<ScriptFunction>, proxy, type);
            }

            // Has computed Name
            return RecyclerNewWithInfoBits(this->GetRecycler(), EnumFunctionClass, ScriptFunctionWithComputedName, proxy, type);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, ScriptFunction, proxy, type);
    }